

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode Curl_http_req_to_h2(dynhds *h2_headers,httpreq *req,Curl_easy *data)

{
  _Bool _Var1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  size_t sVar5;
  dynhds_entry *pdVar6;
  bool bVar7;
  CURLcode local_44;
  ulong uStack_40;
  CURLcode result;
  size_t i;
  dynhds_entry *e;
  char *authority;
  char *scheme;
  Curl_easy *data_local;
  httpreq *req_local;
  dynhds *h2_headers_local;
  
  authority = (char *)0x0;
  e = (dynhds_entry *)0x0;
  if (req->scheme == (char *)0x0) {
    iVar2 = strcmp("CONNECT",req->method);
    if (iVar2 != 0) {
      pcVar3 = Curl_checkheaders(data,":scheme",7);
      if (pcVar3 == (char *)0x0) {
        bVar7 = false;
        if (data->conn != (connectdata *)0x0) {
          bVar7 = (data->conn->handler->flags & 1) != 0;
        }
        authority = "http";
        if (bVar7) {
          authority = "https";
        }
      }
      else {
        authority = pcVar3 + 8;
        while( true ) {
          bVar7 = false;
          if ((*authority != '\0') && (bVar7 = true, *authority != ' ')) {
            bVar7 = *authority == '\t';
          }
          if (!bVar7) break;
          authority = authority + 1;
        }
        if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0))
           && (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level))
              )) {
          Curl_infof(data,"set pseudo header %s to %s",":scheme",authority);
        }
      }
    }
  }
  else {
    authority = req->scheme;
  }
  if (req->authority == (char *)0x0) {
    pdVar6 = Curl_dynhds_get(&req->headers,"Host",4);
    if (pdVar6 != (dynhds_entry *)0x0) {
      e = (dynhds_entry *)pdVar6->value;
    }
  }
  else {
    e = (dynhds_entry *)req->authority;
  }
  Curl_dynhds_reset(h2_headers);
  Curl_dynhds_set_opts(h2_headers,1);
  sVar4 = strlen(req->method);
  local_44 = Curl_dynhds_add(h2_headers,":method",7,req->method,sVar4);
  if ((local_44 == CURLE_OK) && (authority != (char *)0x0)) {
    sVar4 = strlen(authority);
    local_44 = Curl_dynhds_add(h2_headers,":scheme",7,authority,sVar4);
  }
  if ((local_44 == CURLE_OK) && (e != (dynhds_entry *)0x0)) {
    sVar4 = strlen((char *)e);
    local_44 = Curl_dynhds_add(h2_headers,":authority",10,(char *)e,sVar4);
  }
  if ((local_44 == CURLE_OK) && (req->path != (char *)0x0)) {
    pcVar3 = req->path;
    sVar4 = strlen(req->path);
    local_44 = Curl_dynhds_add(h2_headers,":path",5,pcVar3,sVar4);
  }
  uStack_40 = 0;
  while( true ) {
    bVar7 = false;
    if (local_44 == CURLE_OK) {
      sVar5 = Curl_dynhds_count(&req->headers);
      bVar7 = uStack_40 < sVar5;
    }
    if (!bVar7) break;
    pdVar6 = Curl_dynhds_getn(&req->headers,uStack_40);
    _Var1 = h2_non_field(pdVar6->name,pdVar6->namelen);
    if (!_Var1) {
      local_44 = Curl_dynhds_add(h2_headers,pdVar6->name,pdVar6->namelen,pdVar6->value,
                                 pdVar6->valuelen);
    }
    uStack_40 = uStack_40 + 1;
  }
  return local_44;
}

Assistant:

CURLcode Curl_http_req_to_h2(struct dynhds *h2_headers,
                             struct httpreq *req, struct Curl_easy *data)
{
  const char *scheme = NULL, *authority = NULL;
  struct dynhds_entry *e;
  size_t i;
  CURLcode result;

  DEBUGASSERT(req);
  DEBUGASSERT(h2_headers);

  if(req->scheme) {
    scheme = req->scheme;
  }
  else if(strcmp("CONNECT", req->method)) {
    scheme = Curl_checkheaders(data, STRCONST(HTTP_PSEUDO_SCHEME));
    if(scheme) {
      scheme += sizeof(HTTP_PSEUDO_SCHEME);
      while(*scheme && ISBLANK(*scheme))
        scheme++;
      infof(data, "set pseudo header %s to %s", HTTP_PSEUDO_SCHEME, scheme);
    }
    else {
      scheme = (data->conn && data->conn->handler->flags & PROTOPT_SSL)?
                "https" : "http";
    }
  }

  if(req->authority) {
    authority = req->authority;
  }
  else {
    e = Curl_dynhds_get(&req->headers, STRCONST("Host"));
    if(e)
      authority = e->value;
  }

  Curl_dynhds_reset(h2_headers);
  Curl_dynhds_set_opts(h2_headers, DYNHDS_OPT_LOWERCASE);
  result = Curl_dynhds_add(h2_headers, STRCONST(HTTP_PSEUDO_METHOD),
                           req->method, strlen(req->method));
  if(!result && scheme) {
    result = Curl_dynhds_add(h2_headers, STRCONST(HTTP_PSEUDO_SCHEME),
                             scheme, strlen(scheme));
  }
  if(!result && authority) {
    result = Curl_dynhds_add(h2_headers, STRCONST(HTTP_PSEUDO_AUTHORITY),
                             authority, strlen(authority));
  }
  if(!result && req->path) {
    result = Curl_dynhds_add(h2_headers, STRCONST(HTTP_PSEUDO_PATH),
                             req->path, strlen(req->path));
  }
  for(i = 0; !result && i < Curl_dynhds_count(&req->headers); ++i) {
    e = Curl_dynhds_getn(&req->headers, i);
    if(!h2_non_field(e->name, e->namelen)) {
      result = Curl_dynhds_add(h2_headers, e->name, e->namelen,
                               e->value, e->valuelen);
    }
  }

  return result;
}